

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResolvingDecoder.cc
# Opt level: O3

int avro::parsing::ResolvingGrammarGenerator::bestBranch(NodePtr *writer,NodePtr *reader)

{
  Type TVar1;
  element_type *peVar2;
  shared_count sVar3;
  bool bVar4;
  int iVar5;
  Type TVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  size_t j;
  ulong uVar9;
  NodePtr local_68;
  element_type *local_58;
  shared_count sStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  shared_count asStack_40 [2];
  ulong uVar8;
  
  TVar1 = writer->px->type_;
  iVar5 = (*reader->px->_vptr_Node[4])();
  uVar8 = CONCAT44(extraout_var,iVar5);
  if (uVar8 != 0) {
    uVar9 = 0;
    do {
      iVar5 = (*reader->px->_vptr_Node[5])(reader->px,uVar9 & 0xffffffff);
      local_68.px = *(element_type **)CONCAT44(extraout_var_00,iVar5);
      local_68.pn.pi_ = (sp_counted_base *)((long *)CONCAT44(extraout_var_00,iVar5))[1];
      if (local_68.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_68.pn.pi_)->use_count_ = (local_68.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      TVar6 = (local_68.px)->type_;
      if (TVar6 == AVRO_NUM_TYPES) {
        resolveSymbol((avro *)&local_58,&local_68);
        sVar3.pi_ = sStack_50.pi_;
        peVar2 = local_58;
        local_58 = (element_type *)0x0;
        sStack_50.pi_ = (sp_counted_base *)0x0;
        local_48 = local_68.px._0_4_;
        uStack_44 = local_68.px._4_4_;
        asStack_40[0].pi_._0_4_ = local_68.pn.pi_._0_4_;
        asStack_40[0].pi_._4_4_ = local_68.pn.pi_._4_4_;
        local_68.px = peVar2;
        local_68.pn.pi_ = sVar3.pi_;
        boost::detail::shared_count::~shared_count(asStack_40);
        boost::detail::shared_count::~shared_count(&sStack_50);
        TVar6 = (local_68.px)->type_;
      }
      if (TVar1 == TVar6) {
        iVar5 = (*(local_68.px)->_vptr_Node[2])();
        if ((char)iVar5 != '\0') {
          iVar5 = (*(local_68.px)->_vptr_Node[3])();
          iVar7 = (*writer->px->_vptr_Node[3])();
          bVar4 = Name::operator==((Name *)CONCAT44(extraout_var_01,iVar5),
                                   (Name *)CONCAT44(extraout_var_02,iVar7));
          if (!bVar4) goto LAB_0019cff3;
        }
        boost::detail::shared_count::~shared_count(&local_68.pn);
        goto LAB_0019d057;
      }
LAB_0019cff3:
      boost::detail::shared_count::~shared_count(&local_68.pn);
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
    uVar9 = 0;
    do {
      iVar5 = (*reader->px->_vptr_Node[5])(reader->px,uVar9 & 0xffffffff);
      iVar5 = *(int *)(*(long *)CONCAT44(extraout_var_03,iVar5) + 8);
      if ((uint)(TVar1 + ~AVRO_INT) < 2) {
        if (iVar5 == 5) goto LAB_0019d057;
      }
      else if ((TVar1 == AVRO_INT) && (iVar5 - 3U < 3)) goto LAB_0019d057;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  uVar9 = 0xffffffff;
LAB_0019d057:
  return (int)uVar9;
}

Assistant:

int ResolvingGrammarGenerator::bestBranch(const NodePtr& writer,
    const NodePtr& reader)
{
    Type t = writer->type();

    const size_t c = reader->leaves();
    for (size_t j = 0; j < c; ++j) {
        NodePtr r = reader->leafAt(j);
        if (r->type() == AVRO_SYMBOLIC) {
            r = resolveSymbol(r);
        }
        if (t == r->type()) {
            if (r->hasName()) {
                if (r->name() == writer->name()) {
                    return j;
                }
            } else {
                return j;
            }
        }
    }

    for (size_t j = 0; j < c; ++j) {
        const NodePtr& r = reader->leafAt(j);
        Type rt = r->type();
        switch (t) {
        case AVRO_INT:
            if (rt == AVRO_LONG || rt == AVRO_DOUBLE || rt == AVRO_FLOAT) {
                return j;
            }
            break;
        case AVRO_LONG:
        case AVRO_FLOAT:
            if (rt == AVRO_DOUBLE) {
                return j;
            }
            break;
        default:
            break;
        }
    }
    return -1;
}